

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_rock_sample.cpp
# Opt level: O2

double __thiscall
despot::SimpleRockSample::ObsProb(SimpleRockSample *this,OBS_TYPE obs,State *state,ACT_TYPE action)

{
  if (action == 3) {
    if (*(int *)(state + 0x20) == 1) {
      return *(double *)(&DAT_00109030 + (ulong)((long)*(int *)(state + 0x24) == obs) * 8);
    }
    if (*(int *)(state + 0x20) == 0) {
      if ((long)*(int *)(state + 0x24) == obs) {
        return 1.0;
      }
      return 0.0;
    }
  }
  if (obs == 1) {
    return 1.0;
  }
  return 0.0;
}

Assistant:

double SimpleRockSample::ObsProb(OBS_TYPE obs, const State& state,
	ACT_TYPE action) const {
	if (action == A_CHECK) {
		const SimpleState& simple_state = static_cast<const SimpleState&>(state);
		int rover_position = simple_state.rover_position;
		int rock_status = simple_state.rock_status;

		if (rover_position == LEFT) {
			// when the rover at LEFT, its observation is correct with probability 1
			return obs == rock_status;
		} else if (rover_position == MIDDLE) {
			// when the rover at MIDDLE, its observation is correct with probability 0.8
			return (obs == rock_status) ? 0.8 : 0.2;
		}
	}

	// when the actions are not A_CHECK, the rover does not receive any observations.
	// Assume it receives a default observation with probability 1.
	return obs == O_GOOD;
}